

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O1

void __thiscall CEditor::Reset(CEditor *this,bool CreateDefault)

{
  undefined3 in_register_00000031;
  
  CEditorMap::Clean(&this->m_Map);
  if (CONCAT31(in_register_00000031,CreateDefault) != 0) {
    CEditorMap::CreateDefault(&this->m_Map);
  }
  this->m_SelectedLayer = 0;
  this->m_SelectedGroup = 0;
  this->m_SelectedQuad = -1;
  this->m_SelectedPoints = 0;
  this->m_SelectedEnvelope = 0;
  this->m_SelectedImage = 0;
  this->m_WorldOffsetX = 0.0;
  this->m_WorldOffsetY = 0.0;
  this->m_EditorOffsetX = 0.0;
  this->m_EditorOffsetY = 0.0;
  this->m_WorldZoom = 1.0;
  this->m_ZoomLevel = 200;
  (this->m_Map).m_Modified = false;
  this->m_ShowEnvelopePreview = 0;
  this->m_MouseDeltaX = 0.0;
  this->m_MouseDeltaY = 0.0;
  this->m_MouseDeltaWx = 0.0;
  this->m_MouseDeltaWy = 0.0;
  return;
}

Assistant:

void CEditor::Reset(bool CreateDefault)
{
	m_Map.Clean();

	// create default layers
	if(CreateDefault)
		m_Map.CreateDefault();

	m_SelectedLayer = 0;
	m_SelectedGroup = 0;
	m_SelectedQuad = -1;
	m_SelectedPoints = 0;
	m_SelectedEnvelope = 0;
	m_SelectedImage = 0;

	m_WorldOffsetX = 0;
	m_WorldOffsetY = 0;
	m_EditorOffsetX = 0.0f;
	m_EditorOffsetY = 0.0f;

	m_WorldZoom = 1.0f;
	m_ZoomLevel = 200;

	m_MouseDeltaX = 0;
	m_MouseDeltaY = 0;
	m_MouseDeltaWx = 0;
	m_MouseDeltaWy = 0;

	m_Map.m_Modified = false;

	m_ShowEnvelopePreview = SHOWENV_NONE;
}